

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
FreeHeapBlock(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this
             ,SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  uint32 *puVar1;
  
  SmallHeapBlockT<SmallAllocationBlockAttributes>::Reset
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock);
  (heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next =
       (SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->emptyBlockList;
  this->emptyBlockList = heapBlock;
  puVar1 = &(this->super_HeapBucket).emptyHeapBlockCount;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::FreeHeapBlock(TBlockType * heapBlock)
{
    heapBlock->Reset();
    heapBlock->SetNextBlock(emptyBlockList);
    emptyBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    this->emptyHeapBlockCount++;
#endif
}